

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O1

bool slang::syntax::SyntaxFacts::isPropertyQualifier(TokenKind kind)

{
  uint uVar1;
  undefined2 in_register_0000003a;
  
  uVar1 = CONCAT22(in_register_0000003a,kind) - 0xf1;
  if ((((0x2b < uVar1) || ((0x80000000301U >> ((ulong)uVar1 & 0x3f) & 1) == 0)) &&
      (CONCAT22(in_register_0000003a,kind) != 0x7d)) &&
     (CONCAT22(in_register_0000003a,kind) != 0xd1)) {
    return false;
  }
  return true;
}

Assistant:

bool SyntaxFacts::isPropertyQualifier(TokenKind kind) {
    switch (kind) {
        case TokenKind::ConstKeyword:
        case TokenKind::RandKeyword:
        case TokenKind::RandCKeyword:
        case TokenKind::StaticKeyword:
        case TokenKind::LocalKeyword:
        case TokenKind::ProtectedKeyword:
            return true;
        default:
            return false;
    }
}